

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.H
# Opt level: O1

void __thiscall Fl_Double_Window::flush(Fl_Double_Window *this,int eraseoverlay)

{
  Fl_X *pFVar1;
  Fl_X *pFVar2;
  int iVar3;
  int *piVar4;
  Window WVar5;
  long lVar6;
  int H;
  int W;
  int Y;
  int X;
  undefined1 local_28;
  
  if ((this->super_Fl_Window).i == (Fl_X *)0x0) {
    return;
  }
  Fl_Window::make_current(&this->super_Fl_Window);
  pFVar1 = (this->super_Fl_Window).i;
  if (pFVar1 == (Fl_X *)0x0) {
    return;
  }
  if (pFVar1->other_xid != 0) goto LAB_001b8dd2;
  if (can_xdbe()::tried == '\0') {
    can_xdbe()::tried = '\x01';
    iVar3 = XdbeQueryExtension(fl_display,&Y,&W);
    if (iVar3 != 0) {
      _X = *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80);
      H = 1;
      piVar4 = (int *)XdbeGetVisualInfo();
      if (piVar4 != (int *)0x0) {
        if (0 < (long)*piVar4) {
          lVar6 = 0;
          do {
            if (*(VisualID *)(*(long *)(piVar4 + 2) + lVar6) == fl_visual->visualid) {
              use_xdbe = '\x01';
              break;
            }
            lVar6 = lVar6 + 0x10;
          } while ((long)*piVar4 * 0x10 != lVar6);
        }
        XdbeFreeVisualInfo(piVar4);
        goto LAB_001b8d52;
      }
    }
LAB_001b8d76:
    WVar5 = XCreatePixmap(fl_display,
                          *(undefined8 *)
                           (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                          (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
                          (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_,fl_visual->depth
                         );
    pFVar1->other_xid = WVar5;
  }
  else {
LAB_001b8d52:
    if (use_xdbe == '\0') goto LAB_001b8d76;
    pFVar2 = (this->super_Fl_Window).i;
    if (pFVar2 == (Fl_X *)0x0) {
      WVar5 = 0;
    }
    else {
      WVar5 = pFVar2->xid;
    }
    WVar5 = XdbeAllocateBackBufferName(fl_display,WVar5,3);
    pFVar1->other_xid = WVar5;
    pFVar1->backbuffer_bad = '\x01';
  }
  (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ = 0x80;
LAB_001b8dd2:
  if (use_xdbe == '\x01') {
    if ((eraseoverlay != 0) || (pFVar1->backbuffer_bad != '\0')) {
      if (pFVar1->region != (Fl_Region)0x0) {
        XDestroyRegion();
        pFVar1->region = (Fl_Region)0x0;
      }
      (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ = 0x80;
      pFVar1->backbuffer_bad = '\0';
    }
    if ((this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ != '\0') {
      Fl_Graphics_Driver::clip_region(fl_graphics_driver,pFVar1->region);
      pFVar1->region = (Fl_Region)0x0;
      fl_window = pFVar1->other_xid;
      (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[2])(this);
      fl_window = pFVar1->xid;
    }
    pFVar1 = (this->super_Fl_Window).i;
    if (pFVar1 == (Fl_X *)0x0) {
      _X = 0;
    }
    else {
      _X = pFVar1->xid;
    }
    local_28 = 3;
    XdbeSwapBuffers(fl_display,&X,1);
  }
  else {
    if (((this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.damage_ & 0xfd) != 0) {
      Fl_Graphics_Driver::clip_region(fl_graphics_driver,pFVar1->region);
      pFVar1->region = (Fl_Region)0x0;
      fl_window = pFVar1->other_xid;
      (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[2])(this);
      fl_window = pFVar1->xid;
    }
    if (eraseoverlay != 0) {
      Fl_Graphics_Driver::clip_region(fl_graphics_driver,(Fl_Region)0x0);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
              (fl_graphics_driver,0,0,
               (ulong)(uint)(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_,
               (ulong)(uint)(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_,&X,&Y,&W,&H);
    if (pFVar1->other_xid != 0) {
      fl_copy_offscreen(X,Y,W,H,pFVar1->other_xid,X,Y);
    }
  }
  return;
}

Assistant:

int shown() {return i != 0;}